

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O1

void hts_idx_save_core(hts_idx_t *idx,void *fp,int fmt)

{
  int32_t *piVar1;
  bidx_t *pbVar2;
  bins_t *pbVar3;
  uint64_t *data;
  lidx_t *plVar4;
  size_t sVar5;
  uint uVar6;
  long lVar7;
  byte bVar8;
  int32_t size;
  khint_t local_54;
  lidx_t *local_50;
  int32_t *local_48;
  hts_idx_t *local_40;
  long local_38;
  
  piVar1 = &idx->n;
  if (fmt == 1) {
    fwrite(piVar1,1,4,(FILE *)fp);
  }
  else {
    bgzf_write((BGZF *)fp,piVar1,4);
  }
  if ((fmt == 2) && ((ulong)idx->l_meta != 0)) {
    bgzf_write((BGZF *)fp,idx->meta,(ulong)idx->l_meta);
  }
  if (0 < *piVar1) {
    lVar7 = 0;
    local_48 = piVar1;
    local_40 = idx;
    do {
      pbVar2 = idx->bidx[lVar7];
      local_54 = 0;
      if (pbVar2 != (bidx_t *)0x0) {
        local_54 = pbVar2->size;
      }
      local_50 = idx->lidx + lVar7;
      local_38 = lVar7;
      if (fmt == 1) {
        fwrite(&local_54,1,4,(FILE *)fp);
      }
      else {
        bgzf_write((BGZF *)fp,&local_54,4);
      }
      if ((pbVar2 != (bidx_t *)0x0) && (pbVar2->n_buckets != 0)) {
        bVar8 = 0;
        uVar6 = 0;
        do {
          if ((pbVar2->flags[uVar6 >> 4] >> (bVar8 & 0x1e) & 3) == 0) {
            pbVar3 = pbVar2->vals;
            if (fmt == 1) {
              fwrite(pbVar2->keys + uVar6,1,4,(FILE *)fp);
            }
            else {
              bgzf_write((BGZF *)fp,pbVar2->keys + uVar6,4);
            }
            if (fmt == 0) {
              bgzf_write((BGZF *)fp,&pbVar2->vals[uVar6].loff,8);
            }
            if (fmt == 1) {
              fwrite(&pbVar3[uVar6].n,1,4,(FILE *)fp);
            }
            else {
              bgzf_write((BGZF *)fp,&pbVar3[uVar6].n,4);
            }
            sVar5 = (size_t)(pbVar3[uVar6].n << 4);
            if (fmt == 1) {
              fwrite(pbVar3[uVar6].list,1,sVar5,(FILE *)fp);
            }
            else {
              bgzf_write((BGZF *)fp,pbVar3[uVar6].list,sVar5);
            }
          }
          uVar6 = uVar6 + 1;
          bVar8 = bVar8 + 2;
        } while (uVar6 != pbVar2->n_buckets);
      }
      lVar7 = local_38;
      idx = local_40;
      piVar1 = local_48;
      plVar4 = local_50;
      if (fmt != 0) {
        if (fmt == 1) {
          fwrite(local_50,1,4,(FILE *)fp);
        }
        else {
          bgzf_write((BGZF *)fp,local_50,4);
        }
        data = plVar4->offset;
        sVar5 = (size_t)(plVar4->n << 3);
        if (fmt == 1) {
          fwrite(data,1,sVar5,(FILE *)fp);
        }
        else {
          bgzf_write((BGZF *)fp,data,sVar5);
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < *piVar1);
  }
  if (fmt == 1) {
    fwrite(&idx->n_no_coor,1,8,(FILE *)fp);
  }
  else {
    bgzf_write((BGZF *)fp,&idx->n_no_coor,8);
  }
  return;
}

Assistant:

static void hts_idx_save_core(const hts_idx_t *idx, void *fp, int fmt)
{
    int32_t i, size, is_be;
    int is_bgzf = (fmt != HTS_FMT_BAI);
    is_be = ed_is_big();
    if (is_be) {
        uint32_t x = idx->n;
        idx_write(is_bgzf, fp, ed_swap_4p(&x), 4);
    } else idx_write(is_bgzf, fp, &idx->n, 4);
    if (fmt == HTS_FMT_TBI && idx->l_meta) idx_write(is_bgzf, fp, idx->meta, idx->l_meta);
    for (i = 0; i < idx->n; ++i) {
        khint_t k;
        bidx_t *bidx = idx->bidx[i];
        lidx_t *lidx = &idx->lidx[i];
        // write binning index
        size = bidx? kh_size(bidx) : 0;
        if (is_be) { // big endian
            uint32_t x = size;
            idx_write(is_bgzf, fp, ed_swap_4p(&x), 4);
        } else idx_write(is_bgzf, fp, &size, 4);
        if (bidx == 0) goto write_lidx;
        for (k = kh_begin(bidx); k != kh_end(bidx); ++k) {
            bins_t *p;
            if (!kh_exist(bidx, k)) continue;
            p = &kh_value(bidx, k);
            if (is_be) { // big endian
                uint32_t x;
                x = kh_key(bidx, k); idx_write(is_bgzf, fp, ed_swap_4p(&x), 4);
                if (fmt == HTS_FMT_CSI) {
                    uint64_t y = kh_val(bidx, k).loff;
                    idx_write(is_bgzf, fp, ed_swap_4p(&y), 8);
                }
                x = p->n; idx_write(is_bgzf, fp, ed_swap_4p(&x), 4);
                swap_bins(p);
                idx_write(is_bgzf, fp, p->list, 16 * p->n);
                swap_bins(p);
            } else {
                idx_write(is_bgzf, fp, &kh_key(bidx, k), 4);
                if (fmt == HTS_FMT_CSI) idx_write(is_bgzf, fp, &kh_val(bidx, k).loff, 8);
                //int j;for(j=0;j<p->n;++j)fprintf(stderr,"%d,%llx,%d,%llx:%llx\n",kh_key(bidx,k),kh_val(bidx, k).loff,j,p->list[j].u,p->list[j].v);
                idx_write(is_bgzf, fp, &p->n, 4);
                idx_write(is_bgzf, fp, p->list, p->n << 4);
            }
        }
write_lidx:
        if (fmt != HTS_FMT_CSI) {
            if (is_be) {
                int32_t x = lidx->n;
                idx_write(is_bgzf, fp, ed_swap_4p(&x), 4);
                for (x = 0; x < lidx->n; ++x) ed_swap_8p(&lidx->offset[x]);
                idx_write(is_bgzf, fp, lidx->offset, lidx->n << 3);
                for (x = 0; x < lidx->n; ++x) ed_swap_8p(&lidx->offset[x]);
            } else {
                idx_write(is_bgzf, fp, &lidx->n, 4);
                idx_write(is_bgzf, fp, lidx->offset, lidx->n << 3);
            }
        }
    }
    if (is_be) { // write the number of reads without coordinates
        uint64_t x = idx->n_no_coor;
        idx_write(is_bgzf, fp, &x, 8);
    } else idx_write(is_bgzf, fp, &idx->n_no_coor, 8);
}